

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectral.hpp
# Opt level: O2

pair<kitty::static_truth_table<5U,_true>,_bool> __thiscall
kitty::detail::miller_spectral_canonization_impl<kitty::static_truth_table<5u,true>>::
run<void(&)(std::vector<kitty::detail::spectral_operation,std::allocator<kitty::detail::spectral_operation>>const&)>
          (miller_spectral_canonization_impl<kitty::static_truth_table<5u,true>> *this,
          _func_void_vector<kitty::detail::spectral_operation,_std::allocator<kitty::detail::spectral_operation>_>_ptr
          *fn)

{
  bool bVar1;
  undefined7 extraout_var;
  pair<kitty::static_truth_table<5U,_true>,_bool> pVar2;
  static_truth_table<5U,_true> tt;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  
  get_rw_coeffecient_order
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_38,
             *(uint32_t *)(this + 8));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(this + 0x78),&local_38);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_38);
  bVar1 = miller_spectral_canonization_impl<kitty::static_truth_table<5U,_true>_>::normalize
                    ((miller_spectral_canonization_impl<kitty::static_truth_table<5U,_true>_> *)this
                    );
  (*fn)((vector<kitty::detail::spectral_operation,_std::allocator<kitty::detail::spectral_operation>_>
         *)(this + 0xa8));
  local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  spectrum::to_truth_table<kitty::static_truth_table<5u,true>>
            ((spectrum *)(this + 0x10),(static_truth_table<5U,_true> *)&local_38);
  pVar2._8_8_ = CONCAT71(extraout_var,bVar1) & 0xffffffff;
  pVar2.first._bits = (uint64_t)local_38._M_impl.super__Vector_impl_data._M_start;
  return pVar2;
}

Assistant:

std::pair<TT, bool> run( Callback&& fn )
  {
    order = get_rw_coeffecient_order( num_vars );
    const auto exact = normalize();

    fn( best_transforms );

    TT tt = func.construct();
    spec.to_truth_table<TT>( tt );
    return { tt, exact };
  }